

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_any_construct_any_object.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  long *plVar2;
  obj *poVar3;
  any b;
  any local_28;
  
  plVar2 = (long *)operator_new(0x10);
  *plVar2 = (long)&PTR__erasure_00104d68;
  plVar2[1] = (long)"test";
  local_28._value = (erasure *)operator_new(0x10);
  (local_28._value)->_vptr_erasure = (_func_int **)&PTR__erasure_00104d68;
  local_28._value[1]._vptr_erasure = (_func_int **)"test";
  poVar3 = type::any::as<obj>(&local_28);
  iVar1 = strcmp(poVar3->str,"test");
  if (local_28._value != (erasure *)0x0) {
    (*(local_28._value)->_vptr_erasure[1])();
  }
  (**(code **)(*plVar2 + 8))(plVar2);
  return -(uint)(iVar1 != 0);
}

Assistant:

int main() {
  try {
    obj o("test");
    type::any a(o);
    type::any b(a);
    if(strcmp(b.as<obj>().str, "test") == 0) {
      return 0;
    }
    return -1;
  }
  catch(...) {
    return -1;
  }
}